

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  uint64_t uVar1;
  int64_t iVar2;
  int64_t *in_RCX;
  int64_t *in_RDX;
  int64_t *in_RSI;
  int in_EDI;
  int i;
  secp256k1_int128 cg;
  secp256k1_int128 cf;
  int64_t gi;
  int64_t fi;
  int64_t r;
  int64_t q;
  int64_t v;
  int64_t u;
  uint64_t M62;
  int local_7c;
  secp256k1_int128 local_78;
  secp256k1_int128 local_68;
  int64_t local_58;
  int64_t local_50;
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  int64_t local_30;
  undefined8 local_28;
  int64_t *local_18;
  int64_t *local_10;
  int local_4;
  
  local_28 = 0x3fffffffffffffff;
  local_30 = *in_RCX;
  local_38 = in_RCX[1];
  local_40 = in_RCX[2];
  local_48 = in_RCX[3];
  local_50 = *in_RSI;
  local_58 = *in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  secp256k1_i128_mul(&local_68,local_30,local_50);
  secp256k1_i128_accum_mul(&local_68,local_38,local_58);
  secp256k1_i128_mul(&local_78,local_40,local_50);
  secp256k1_i128_accum_mul(&local_78,local_48,local_58);
  secp256k1_i128_rshift(&local_68,0x3e);
  secp256k1_i128_rshift(&local_78,0x3e);
  for (local_7c = 1; local_7c < local_4; local_7c = local_7c + 1) {
    local_50 = local_10[local_7c];
    local_58 = local_18[local_7c];
    secp256k1_i128_accum_mul(&local_68,local_30,local_50);
    secp256k1_i128_accum_mul(&local_68,local_38,local_58);
    secp256k1_i128_accum_mul(&local_78,local_40,local_50);
    secp256k1_i128_accum_mul(&local_78,local_48,local_58);
    uVar1 = secp256k1_i128_to_u64(&local_68);
    local_10[local_7c + -1] = uVar1 & 0x3fffffffffffffff;
    secp256k1_i128_rshift(&local_68,0x3e);
    uVar1 = secp256k1_i128_to_u64(&local_78);
    local_18[local_7c + -1] = uVar1 & 0x3fffffffffffffff;
    secp256k1_i128_rshift(&local_78,0x3e);
  }
  iVar2 = secp256k1_i128_to_i64(&local_68);
  local_10[local_4 + -1] = iVar2;
  iVar2 = secp256k1_i128_to_i64(&local_78);
  local_18[local_4 + -1] = iVar2;
  return;
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}